

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextEndFrame(ImGuiContext *ctx)

{
  bool bVar1;
  ImGuiStoragePair *pIVar2;
  ImVec2 *lhs;
  float _y;
  ImRect local_6c;
  ImDrawFlags local_5c;
  ImVec2 IStack_58;
  ImDrawFlags bg_rounding_flags;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect bg_rect;
  ImGuiDockNode *node;
  int n;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiContext *ctx_local;
  
  for (node._4_4_ = 0; node._4_4_ < (ctx->DockContext).Nodes.Data.Size; node._4_4_ = node._4_4_ + 1)
  {
    pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,node._4_4_);
    bg_rect.Max = *(ImVec2 *)&(pIVar2->field_1).val_i;
    if ((((bg_rect.Max != (ImVec2)0x0) && (*(int *)((long)bg_rect.Max + 0xb0) == ctx->FrameCount))
        && ((*(ushort *)((long)bg_rect.Max + 0xc4) >> 9 & 1) != 0)) &&
       (((*(ImGuiWindow **)((long)bg_rect.Max + 0x88) != (ImGuiWindow *)0x0 &&
         (bVar1 = ImGuiDockNode::IsLeafNode((ImGuiDockNode *)bg_rect.Max), bVar1)) &&
        ((*(ushort *)((long)bg_rect.Max + 0xc4) >> 0xb & 1) == 0)))) {
      lhs = (ImVec2 *)((long)bg_rect.Max + 0x48);
      _y = GetFrameHeight();
      ImVec2::ImVec2(&local_50,0.0,_y);
      local_48 = ::operator+(lhs,&local_50);
      IStack_58 = ::operator+((ImVec2 *)((long)bg_rect.Max + 0x48),
                              (ImVec2 *)((long)bg_rect.Max + 0x50));
      ImRect::ImRect((ImRect *)local_40,&local_48,&stack0xffffffffffffffa8);
      local_6c = ImGuiWindow::Rect(*(ImGuiWindow **)((long)bg_rect.Max + 0x88));
      local_5c = CalcRoundingFlagsForRectInRect((ImRect *)local_40,&local_6c,2.0);
      ImDrawList::ChannelsSetCurrent
                (*(ImDrawList **)(*(long *)((long)bg_rect.Max + 0x88) + 0x2b8),0);
      ImDrawList::AddRectFilled
                (*(ImDrawList **)(*(long *)((long)bg_rect.Max + 0x88) + 0x2b8),(ImVec2 *)local_40,
                 &bg_rect.Min,*(ImU32 *)((long)bg_rect.Max + 0x80),
                 *(float *)(*(long *)((long)bg_rect.Max + 0x88) + 0x80),local_5c);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextEndFrame(ImGuiContext* ctx)
{
    // Draw backgrounds of node missing their window
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = &g.DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->LastFrameActive == g.FrameCount && node->IsVisible && node->HostWindow && node->IsLeafNode() && !node->IsBgDrawnThisFrame)
            {
                ImRect bg_rect(node->Pos + ImVec2(0.0f, GetFrameHeight()), node->Pos + node->Size);
                ImDrawFlags bg_rounding_flags = CalcRoundingFlagsForRectInRect(bg_rect, node->HostWindow->Rect(), DOCKING_SPLITTER_SIZE);
                node->HostWindow->DrawList->ChannelsSetCurrent(0);
                node->HostWindow->DrawList->AddRectFilled(bg_rect.Min, bg_rect.Max, node->LastBgColor, node->HostWindow->WindowRounding, bg_rounding_flags);
            }
}